

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

bool __thiscall tinyxml2::XMLPrinter::Visit(XMLPrinter *this,XMLText *text)

{
  int iVar1;
  undefined4 extraout_var;
  char *text_00;
  
  iVar1 = (*(text->super_XMLNode)._vptr_XMLNode[9])(text);
  if (CONCAT44(extraout_var,iVar1) == 0) {
    text_00 = StrPair::GetStr(&(text->super_XMLNode)._value);
  }
  else {
    text_00 = (char *)0x0;
  }
  PushText(this,text_00,text->_isCData);
  return true;
}

Assistant:

bool XMLPrinter::Visit( const XMLText& text )
{
    PushText( text.Value(), text.CData() );
    return true;
}